

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::DotProductDoingExtract::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  bool bVar1;
  Op OVar2;
  int iVar3;
  ConstantManager *const_mgr_00;
  const_reference ppCVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar6;
  reference ppCVar7;
  float fVar8;
  double local_1b8;
  uint32_t local_1a4;
  iterator local_1a0;
  undefined8 local_198;
  SmallVector<unsigned_int,_2UL> local_190;
  Operand local_168;
  uint32_t local_134;
  iterator local_130;
  undefined8 local_128;
  SmallVector<unsigned_int,_2UL> local_120;
  Operand local_f8;
  undefined1 local_c8 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  double value;
  Constant *element;
  uint32_t j;
  bool all_others_zero;
  uint32_t component_with_one;
  uint32_t kNotFound;
  undefined1 local_70 [8];
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  components;
  uint32_t element_width;
  Float *element_type;
  Vector *vector_type;
  int i;
  ConstantManager *const_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar2 = Instruction::opcode(inst);
  if (OVar2 != OpDot) {
    __assert_fail("inst->opcode() == spv::Op::OpDot && \"Wrong opcode.  Should be OpDot.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x9ef,
                  "auto spvtools::opt::(anonymous namespace)::DotProductDoingExtract()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  const_mgr_00 = IRContext::get_constant_mgr(context);
  bVar1 = Instruction::IsFloatingPointFoldingAllowed(inst);
  if (bVar1) {
    for (vector_type._4_4_ = 0; vector_type._4_4_ < 2; vector_type._4_4_ = vector_type._4_4_ + 1) {
      ppCVar4 = std::
                vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ::operator[](constants,(long)vector_type._4_4_);
      if (*ppCVar4 != (value_type)0x0) {
        ppCVar4 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](constants,(long)vector_type._4_4_);
        pTVar5 = analysis::Constant::type(*ppCVar4);
        iVar3 = (*pTVar5->_vptr_Type[0xe])();
        if ((Vector *)CONCAT44(extraout_var,iVar3) == (Vector *)0x0) {
          __assert_fail("vector_type && \"Inputs to OpDot must be vectors.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x9fd,
                        "auto spvtools::opt::(anonymous namespace)::DotProductDoingExtract()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                       );
        }
        pTVar5 = analysis::Vector::element_type((Vector *)CONCAT44(extraout_var,iVar3));
        iVar3 = (*pTVar5->_vptr_Type[0xc])();
        if ((Float *)CONCAT44(extraout_var_00,iVar3) == (Float *)0x0) {
          __assert_fail("element_type && \"Inputs to OpDot must be vectors of floats.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0xa00,
                        "auto spvtools::opt::(anonymous namespace)::DotProductDoingExtract()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                       );
        }
        components.
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             analysis::Float::width((Float *)CONCAT44(extraout_var_00,iVar3));
        if ((components.
             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0x20) &&
           (components.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0x40)) {
          this_local._7_1_ = 0;
          goto LAB_0037bc76;
        }
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)local_70);
        ppCVar4 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](constants,(long)vector_type._4_4_);
        analysis::Constant::GetVectorComponents
                  ((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)&component_with_one,*ppCVar4,const_mgr_00);
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::operator=((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     *)local_70,
                    (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     *)&component_with_one);
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   *)&component_with_one);
        j = 0xffffffff;
        bVar1 = true;
        for (element._0_4_ = 0;
            sVar6 = std::
                    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ::size((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            *)local_70), (uint)element < sVar6; element._0_4_ = (uint)element + 1) {
          ppCVar7 = std::
                    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  *)local_70,(ulong)(uint)element);
          if (components.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x20) {
            fVar8 = analysis::Constant::GetFloat(*ppCVar7);
            local_1b8 = (double)fVar8;
          }
          else {
            local_1b8 = analysis::Constant::GetDouble(*ppCVar7);
          }
          if ((local_1b8 != 0.0) || (NAN(local_1b8))) {
            if ((local_1b8 != 1.0) || (NAN(local_1b8))) {
              bVar1 = false;
              break;
            }
            if (j != 0xffffffff) {
              j = 0xffffffff;
              break;
            }
            j = (uint)element;
          }
        }
        if ((bVar1) && (j != 0xffffffff)) {
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_c8);
          local_134 = Instruction::GetSingleWordInOperand(inst,1 - vector_type._4_4_);
          local_130 = &local_134;
          local_128 = 1;
          init_list_00._M_len = 1;
          init_list_00._M_array = local_130;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_120,init_list_00);
          Operand::Operand(&local_f8,SPV_OPERAND_TYPE_ID,&local_120);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_c8,&local_f8);
          Operand::~Operand(&local_f8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_120);
          local_1a4 = j;
          local_1a0 = &local_1a4;
          local_198 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_1a0;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_190,init_list);
          Operand::Operand(&local_168,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_190);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_c8,&local_168);
          Operand::~Operand(&local_168);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_190);
          Instruction::SetOpcode(inst,OpCompositeExtract);
          Instruction::SetInOperands(inst,(OperandList *)local_c8);
          this_local._7_1_ = 1;
          operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_c8);
        }
        else {
          operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
        }
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   *)local_70);
        if (operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) goto LAB_0037bc76;
      }
    }
    this_local._7_1_ = 0;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0037bc76:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

FoldingRule DotProductDoingExtract() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpDot &&
           "Wrong opcode.  Should be OpDot.");

    analysis::ConstantManager* const_mgr = context->get_constant_mgr();

    if (!inst->IsFloatingPointFoldingAllowed()) {
      return false;
    }

    for (int i = 0; i < 2; ++i) {
      if (!constants[i]) {
        continue;
      }

      const analysis::Vector* vector_type = constants[i]->type()->AsVector();
      assert(vector_type && "Inputs to OpDot must be vectors.");
      const analysis::Float* element_type =
          vector_type->element_type()->AsFloat();
      assert(element_type && "Inputs to OpDot must be vectors of floats.");
      uint32_t element_width = element_type->width();
      if (element_width != 32 && element_width != 64) {
        return false;
      }

      std::vector<const analysis::Constant*> components;
      components = constants[i]->GetVectorComponents(const_mgr);

      constexpr uint32_t kNotFound = std::numeric_limits<uint32_t>::max();

      uint32_t component_with_one = kNotFound;
      bool all_others_zero = true;
      for (uint32_t j = 0; j < components.size(); ++j) {
        const analysis::Constant* element = components[j];
        double value =
            (element_width == 32 ? element->GetFloat() : element->GetDouble());
        if (value == 0.0) {
          continue;
        } else if (value == 1.0) {
          if (component_with_one == kNotFound) {
            component_with_one = j;
          } else {
            component_with_one = kNotFound;
            break;
          }
        } else {
          all_others_zero = false;
          break;
        }
      }

      if (!all_others_zero || component_with_one == kNotFound) {
        continue;
      }

      std::vector<Operand> operands;
      operands.push_back(
          {SPV_OPERAND_TYPE_ID, {inst->GetSingleWordInOperand(1u - i)}});
      operands.push_back(
          {SPV_OPERAND_TYPE_LITERAL_INTEGER, {component_with_one}});

      inst->SetOpcode(spv::Op::OpCompositeExtract);
      inst->SetInOperands(std::move(operands));
      return true;
    }
    return false;
  };
}